

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Pooling3DLayerParams::SerializeWithCachedSizes
          (Pooling3DLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  Pooling3DLayerParams_PoolingType3D PVar2;
  int32 iVar3;
  Pooling3DLayerParams_Pooling3DPaddingType PVar4;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  Pooling3DLayerParams *this_local;
  
  PVar2 = type(this);
  if (PVar2 != Pooling3DLayerParams_PoolingType3D_MAX) {
    PVar2 = type(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(1,PVar2,output);
  }
  iVar3 = kerneldepth(this);
  if (iVar3 != 0) {
    iVar3 = kerneldepth(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(2,iVar3,output);
  }
  iVar3 = kernelheight(this);
  if (iVar3 != 0) {
    iVar3 = kernelheight(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(3,iVar3,output);
  }
  iVar3 = kernelwidth(this);
  if (iVar3 != 0) {
    iVar3 = kernelwidth(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(4,iVar3,output);
  }
  iVar3 = stridedepth(this);
  if (iVar3 != 0) {
    iVar3 = stridedepth(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(5,iVar3,output);
  }
  iVar3 = strideheight(this);
  if (iVar3 != 0) {
    iVar3 = strideheight(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(6,iVar3,output);
  }
  iVar3 = stridewidth(this);
  if (iVar3 != 0) {
    iVar3 = stridewidth(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(7,iVar3,output);
  }
  iVar3 = custompaddingfront(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingfront(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(8,iVar3,output);
  }
  iVar3 = custompaddingback(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingback(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(9,iVar3,output);
  }
  iVar3 = custompaddingtop(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingtop(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(10,iVar3,output);
  }
  iVar3 = custompaddingbottom(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingbottom(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0xb,iVar3,output);
  }
  iVar3 = custompaddingleft(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingleft(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0xc,iVar3,output);
  }
  iVar3 = custompaddingright(this);
  if (iVar3 != 0) {
    iVar3 = custompaddingright(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0xd,iVar3,output);
  }
  bVar1 = countexcludepadding(this);
  if (bVar1) {
    bVar1 = countexcludepadding(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0xe,bVar1,output);
  }
  PVar4 = paddingtype(this);
  if (PVar4 != Pooling3DLayerParams_Pooling3DPaddingType_CUSTOM) {
    PVar4 = paddingtype(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(0xf,PVar4,output);
  }
  return;
}

Assistant:

void Pooling3DLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Pooling3DLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Pooling3DLayerParams.PoolingType3D type = 1;
  if (this->type() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->type(), output);
  }

  // int32 kernelDepth = 2;
  if (this->kerneldepth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(2, this->kerneldepth(), output);
  }

  // int32 kernelHeight = 3;
  if (this->kernelheight() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(3, this->kernelheight(), output);
  }

  // int32 kernelWidth = 4;
  if (this->kernelwidth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(4, this->kernelwidth(), output);
  }

  // int32 strideDepth = 5;
  if (this->stridedepth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(5, this->stridedepth(), output);
  }

  // int32 strideHeight = 6;
  if (this->strideheight() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(6, this->strideheight(), output);
  }

  // int32 strideWidth = 7;
  if (this->stridewidth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(7, this->stridewidth(), output);
  }

  // int32 customPaddingFront = 8;
  if (this->custompaddingfront() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(8, this->custompaddingfront(), output);
  }

  // int32 customPaddingBack = 9;
  if (this->custompaddingback() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(9, this->custompaddingback(), output);
  }

  // int32 customPaddingTop = 10;
  if (this->custompaddingtop() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(10, this->custompaddingtop(), output);
  }

  // int32 customPaddingBottom = 11;
  if (this->custompaddingbottom() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(11, this->custompaddingbottom(), output);
  }

  // int32 customPaddingLeft = 12;
  if (this->custompaddingleft() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(12, this->custompaddingleft(), output);
  }

  // int32 customPaddingRight = 13;
  if (this->custompaddingright() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(13, this->custompaddingright(), output);
  }

  // bool countExcludePadding = 14;
  if (this->countexcludepadding() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(14, this->countexcludepadding(), output);
  }

  // .CoreML.Specification.Pooling3DLayerParams.Pooling3DPaddingType paddingType = 15;
  if (this->paddingtype() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      15, this->paddingtype(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Pooling3DLayerParams)
}